

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall capnp::compiler::Compiler::Node::Content::~Content(Content *this)

{
  Reader *pRVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Reader *pRVar4;
  Node **ppNVar5;
  RemoveConst<capnp::compiler::Compiler::Node_*> *ppNVar6;
  Node **ppNVar7;
  
  pRVar1 = (this->sourceInfo).ptr;
  if (pRVar1 != (Reader *)0x0) {
    sVar2 = (this->sourceInfo).size_;
    (this->sourceInfo).ptr = (Reader *)0x0;
    (this->sourceInfo).size_ = 0;
    pAVar3 = (this->sourceInfo).disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pRVar1,0x30,sVar2,sVar2,0);
  }
  pRVar4 = (this->auxSchemas).ptr;
  if (pRVar4 != (Reader *)0x0) {
    sVar2 = (this->auxSchemas).size_;
    (this->auxSchemas).ptr = (Reader *)0x0;
    (this->auxSchemas).size_ = 0;
    pAVar3 = (this->auxSchemas).disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pRVar4,0x30,sVar2,sVar2,0);
  }
  std::
  _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_>_>_>
  ::~_Rb_tree(&(this->aliases)._M_t);
  ppNVar5 = (this->orderedNestedNodes).builder.ptr;
  if (ppNVar5 != (Node **)0x0) {
    ppNVar6 = (this->orderedNestedNodes).builder.pos;
    ppNVar7 = (this->orderedNestedNodes).builder.endPtr;
    (this->orderedNestedNodes).builder.ptr = (Node **)0x0;
    (this->orderedNestedNodes).builder.pos = (RemoveConst<capnp::compiler::Compiler::Node_*> *)0x0;
    (this->orderedNestedNodes).builder.endPtr = (Node **)0x0;
    pAVar3 = (this->orderedNestedNodes).builder.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,ppNVar5,8,(long)ppNVar6 - (long)ppNVar5 >> 3,
               (long)ppNVar7 - (long)ppNVar5 >> 3,0);
  }
  std::
  _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>_>_>_>
  ::~_Rb_tree(&(this->nestedNodes)._M_t);
  return;
}

Assistant:

inline Content(): state(STUB) {}